

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::fastcgi::on_start_request(fastcgi *this,error_code *e,handler *h)

{
  bool bVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar2;
  reference pvVar3;
  size_type sVar4;
  error_code *e_00;
  reference pvVar5;
  error_code *in_RDX;
  error_code *in_RSI;
  string *in_RDI;
  fcgi_end_request_body *body_1;
  fcgi_request_body *body;
  string name;
  uint i;
  ostringstream ss;
  locale l;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pairs;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  callback<void_(const_std::error_code_&)> *this_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc80;
  fastcgi *in_stack_fffffffffffffc88;
  allocator *in_stack_fffffffffffffc90;
  undefined5 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9d;
  undefined1 in_stack_fffffffffffffc9e;
  undefined1 in_stack_fffffffffffffc9f;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  fastcgi *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcd8;
  fastcgi *in_stack_fffffffffffffce0;
  callback<void_(const_std::error_code_&)> in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  handler *in_stack_fffffffffffffd58;
  fastcgi *in_stack_fffffffffffffd60;
  allocator local_259;
  string local_258 [32];
  string local_238 [32];
  string local_218 [36];
  uint local_1f4;
  locale local_1f0 [8];
  ostringstream local_1e8 [376];
  locale local_70 [12];
  int local_64;
  error_code local_60 [2];
  undefined1 local_40 [40];
  error_code *local_18;
  
  local_18 = in_RDX;
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&)>::operator()
              ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc90,
               (error_code *)in_stack_fffffffffffffc88);
  }
  else if (in_RDI[9].field_2._M_local_buf[0] == '\x01') {
    if (in_RDI[9].field_2._M_local_buf[1] == '\t') {
      in_RDI[9].field_2._M_local_buf[1] = '\n';
      in_stack_fffffffffffffcc0 = (fastcgi *)local_40;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x48c2fa);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve(in_stack_fffffffffffffca0,
                CONCAT17(in_stack_fffffffffffffc9f,
                         CONCAT16(in_stack_fffffffffffffc9e,
                                  CONCAT15(in_stack_fffffffffffffc9d,in_stack_fffffffffffffc98))));
      in_stack_fffffffffffffcbf =
           parse_pairs((fastcgi *)in_stack_fffffffffffffce8.call_ptr.p_,
                       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffce0);
      if ((bool)in_stack_fffffffffffffcbf) {
        std::vector<char,_std::allocator<char>_>::clear
                  ((vector<char,_std::allocator<char>_> *)0x48c3a3);
        std::locale::locale(local_70,"C");
        std::__cxx11::ostringstream::ostringstream(local_1e8);
        std::ios::imbue(local_1f0);
        std::locale::~locale(local_1f0);
        std::ostream::operator<<(local_1e8,*(int *)((long)&in_RDI[0xb].field_2 + 4));
        local_1f4 = 0;
        while( true ) {
          in_stack_fffffffffffffca0 =
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(ulong)local_1f4;
          pvVar2 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_40);
          if (pvVar2 <= in_stack_fffffffffffffca0) break;
          pvVar3 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_40,(ulong)local_1f4);
          std::__cxx11::string::string(local_218,(string *)pvVar3);
          in_stack_fffffffffffffc9f =
               std::operator==(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
          if (((bool)in_stack_fffffffffffffc9f) ||
             (in_stack_fffffffffffffc9e =
                   std::operator==(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68),
             (bool)in_stack_fffffffffffffc9e)) {
            std::__cxx11::ostringstream::str();
            add_pair(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_RDI);
            std::__cxx11::string::~string(local_238);
          }
          else {
            in_stack_fffffffffffffc9d =
                 std::operator==(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
            if ((bool)in_stack_fffffffffffffc9d) {
              in_stack_fffffffffffffc90 = &local_259;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_258,"0",in_stack_fffffffffffffc90);
              add_pair(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_RDI);
              std::__cxx11::string::~string(local_258);
              std::allocator<char>::~allocator((allocator<char> *)&local_259);
            }
          }
          std::__cxx11::string::~string(local_218);
          local_1f4 = local_1f4 + 1;
        }
        self(in_stack_fffffffffffffc88);
        mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                  ((offset_in_fastcgi_to_subr)in_stack_fffffffffffffca0,
                   (shared_ptr<cppcms::impl::cgi::fastcgi> *)
                   CONCAT17(in_stack_fffffffffffffc9f,
                            CONCAT16(in_stack_fffffffffffffc9e,
                                     CONCAT15(in_stack_fffffffffffffc9d,in_stack_fffffffffffffc98)))
                   ,(callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc90);
        booster::callback<void(std::error_code_const&)>::
        callback<booster::callable<void(std::error_code_const&)>>
                  ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc70,
                   in_stack_fffffffffffffc68);
        async_send_respnse(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        booster::callback<void_(const_std::error_code_&)>::~callback
                  ((callback<void_(const_std::error_code_&)> *)0x48c717);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
                   in_stack_fffffffffffffc70);
        std::shared_ptr<cppcms::impl::cgi::fastcgi>::~shared_ptr
                  ((shared_ptr<cppcms::impl::cgi::fastcgi> *)0x48c731);
        std::__cxx11::ostringstream::~ostringstream(local_1e8);
        std::locale::~locale(local_70);
        local_64 = 0;
      }
      else {
        std::error_code::error_code(local_60,1,(error_category *)&cppcms_category);
        booster::callback<void_(const_std::error_code_&)>::operator()
                  ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc90,
                   (error_code *)in_stack_fffffffffffffc88);
        local_64 = 1;
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(in_stack_fffffffffffffc80);
      if (local_64 != 0) {
        return;
      }
    }
    else if (in_RDI[9].field_2._M_local_buf[1] != '\x01') {
      (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,local_18);
      return;
    }
    sVar4 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)(in_RDI + 10));
    if (sVar4 == 8) {
      e_00 = (error_code *)
             std::vector<char,_std::allocator<char>_>::front
                       ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc70);
      fcgi_request_body::to_host((fcgi_request_body *)in_stack_fffffffffffffc70);
      in_RDI[0xb].field_2._M_local_buf[0] =
           ((ulong)((pointer_type *)&e_00->_M_value)->p_ & 0x10000) != 0;
      if (*(short *)&((pointer_type *)&e_00->_M_value)->p_ == 1) {
        *(uint *)((long)&in_RDI[0xb]._M_string_length + 4) =
             (uint)*(ushort *)((long)&in_RDI[9].field_2 + 2);
        std::vector<char,_std::allocator<char>_>::clear
                  ((vector<char,_std::allocator<char>_> *)0x48ca84);
        bVar1 = non_blocking_read_record(in_stack_fffffffffffffc88);
        if (bVar1) {
          std::error_code::error_code((error_code *)in_stack_fffffffffffffc70);
          params_record_expected
                    (in_stack_fffffffffffffd60,e_00,
                     (handler *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
        }
        else {
          this_00 = (callback<void_(const_std::error_code_&)> *)&stack0xfffffffffffffce8;
          self(in_stack_fffffffffffffc88);
          mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                    ((offset_in_fastcgi_to_subr)in_stack_fffffffffffffca0,
                     (shared_ptr<cppcms::impl::cgi::fastcgi> *)
                     CONCAT17(in_stack_fffffffffffffc9f,
                              CONCAT16(in_stack_fffffffffffffc9e,
                                       CONCAT15(in_stack_fffffffffffffc9d,in_stack_fffffffffffffc98)
                                      )),
                     (callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc90);
          booster::callback<void(std::error_code_const&)>::
          callback<booster::callable<void(std::error_code_const&)>>
                    (this_00,in_stack_fffffffffffffc68);
          async_read_record(in_stack_fffffffffffffcc0,
                            (handler *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8)
                           );
          booster::callback<void_(const_std::error_code_&)>::~callback
                    ((callback<void_(const_std::error_code_&)> *)0x48cb4a);
          booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                    (&this_00->call_ptr);
          std::shared_ptr<cppcms::impl::cgi::fastcgi>::~shared_ptr
                    ((shared_ptr<cppcms::impl::cgi::fastcgi> *)0x48cb64);
        }
      }
      else {
        in_RDI[9].field_2._M_local_buf[1] = '\x03';
        std::vector<char,_std::allocator<char>_>::assign
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc70,
                   (size_type)in_stack_fffffffffffffc68,(value_type_conflict *)0x48c91a);
        pvVar5 = std::vector<char,_std::allocator<char>_>::front
                           ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc70);
        pvVar5[4] = '\x03';
        fcgi_end_request_body::to_net((fcgi_end_request_body *)in_stack_fffffffffffffc70);
        self(in_stack_fffffffffffffc88);
        mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                  ((offset_in_fastcgi_to_subr)in_stack_fffffffffffffca0,
                   (shared_ptr<cppcms::impl::cgi::fastcgi> *)
                   CONCAT17(in_stack_fffffffffffffc9f,
                            CONCAT16(in_stack_fffffffffffffc9e,
                                     CONCAT15(in_stack_fffffffffffffc9d,in_stack_fffffffffffffc98)))
                   ,(callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc90);
        booster::callback<void(std::error_code_const&)>::
        callback<booster::callable<void(std::error_code_const&)>>
                  ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc70,
                   in_stack_fffffffffffffc68);
        async_send_respnse(in_stack_fffffffffffffd60,(handler *)e_00);
        booster::callback<void_(const_std::error_code_&)>::~callback
                  ((callback<void_(const_std::error_code_&)> *)0x48c9db);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
                   in_stack_fffffffffffffc70);
        std::shared_ptr<cppcms::impl::cgi::fastcgi>::~shared_ptr
                  ((shared_ptr<cppcms::impl::cgi::fastcgi> *)0x48c9f5);
      }
    }
    else {
      std::error_code::error_code
                ((error_code *)&stack0xfffffffffffffd60,1,(error_category *)&cppcms_category);
      booster::callback<void_(const_std::error_code_&)>::operator()
                ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc90,local_18);
    }
  }
  else {
    std::error_code::error_code
              ((error_code *)(local_40 + 0x18),1,(error_category *)&cppcms_category);
    booster::callback<void_(const_std::error_code_&)>::operator()
              ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffc90,
               (error_code *)in_stack_fffffffffffffc88);
  }
  return;
}

Assistant:

void on_start_request(booster::system::error_code const &e,handler const &h)
		{
			if(e) {
				h(e);
				return;
			}
			if(header_.version!=fcgi_version_1)
			{
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			if(header_.type==fcgi_get_values) {
				header_.type = fcgi_get_values_result;
				std::vector<std::pair<std::string,std::string> > pairs;
				pairs.reserve(4);
				if(!parse_pairs(pairs)) {
					h(booster::system::error_code(errc::protocol_violation,cppcms_category));
					return;
				}
				body_.clear();
				std::locale l("C");
				std::ostringstream ss;
				ss.imbue(l);
				ss<<cuncurrency_hint_;
				for(unsigned i=0;i<pairs.size();i++) {
					std::string name=pairs[i].first;
					if(name=="FCGI_MAX_CONNS" || name=="FCGI_MAX_REQS")
						add_pair(name,ss.str());
					else if(name=="FCGI_MPXS_CONNS")
						add_pair(name,"0");
				}
				async_send_respnse(mfunc_to_event_handler(&fastcgi::on_params_response_sent,
								self(),
								h));
			}
			else if(header_.type!=fcgi_begin_request) {
				async_read_headers(h);
				return;
			}
			
			if(body_.size()!=sizeof(fcgi_request_body)) {
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			fcgi_request_body *body=reinterpret_cast<fcgi_request_body*>(&body_.front());
			body->to_host();
			keep_alive_=body->flags & fcgi_keep_conn;
			
			if(body->role!=fcgi_responder) {
				header_.type=fcgi_end_request;
				body_.assign(0,8);
				fcgi_end_request_body *body=reinterpret_cast<fcgi_end_request_body*>(&body_.front());
				body->protocol_status=fcgi_unknown_role;
				body->to_net();
				async_send_respnse(mfunc_to_event_handler(&fastcgi::on_params_response_sent,
								self(),
								h));
				return;
			}
			request_id_=header_.request_id;
			
			body_.clear();
			if(non_blocking_read_record()) {
				params_record_expected(booster::system::error_code(),h);
			}
			else {
				async_read_record(mfunc_to_event_handler(&fastcgi::params_record_expected,self(),h));
			}
		}